

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_topal.c
# Opt level: O0

int gdImageTrueColorToPaletteBody(gdImagePtr oim,int dither,int colorsWanted,gdImagePtr *cimP)

{
  uchar **ppuVar1;
  uchar *puVar2;
  gdImagePtr src;
  hist3d ppahVar3;
  hist2d pahVar4;
  FSERRPTR pFVar5;
  size_t size;
  int local_64;
  gdImagePtr local_50;
  gdImagePtr nim;
  int maxColors;
  size_t arraysize;
  int conversionSucceeded;
  int i;
  my_cquantize_ptr cquantize;
  gdImagePtr *cimP_local;
  int colorsWanted_local;
  int dither_local;
  gdImagePtr oim_local;
  
  _conversionSucceeded = (my_cquantize_ptr)0x0;
  nim._4_4_ = 0x100;
  local_50 = oim;
  if (cimP != (gdImagePtr *)0x0) {
    local_50 = gdImageCreate(oim->sx,oim->sy);
    *cimP = local_50;
    if (local_50 == (gdImagePtr)0x0) {
      return 0;
    }
  }
  if (oim->trueColor == 0) {
    if (cimP != (gdImagePtr *)0x0) {
      gdImageCopy(local_50,oim,0,0,0,0,oim->sx,oim->sy);
      *cimP = local_50;
    }
    return 1;
  }
  if (-1 < oim->transparent) {
    nim._4_4_ = 0xff;
  }
  cimP_local._0_4_ = colorsWanted;
  if (nim._4_4_ < colorsWanted) {
    cimP_local._0_4_ = nim._4_4_;
  }
  if (cimP == (gdImagePtr *)0x0) {
    ppuVar1 = (uchar **)gdCalloc(8,(long)oim->sy);
    local_50->pixels = ppuVar1;
    if (local_50->pixels != (uchar **)0x0) {
      for (arraysize._4_4_ = 0; arraysize._4_4_ < local_50->sy;
          arraysize._4_4_ = arraysize._4_4_ + 1) {
        puVar2 = (uchar *)gdCalloc(1,(long)oim->sx);
        local_50->pixels[arraysize._4_4_] = puVar2;
        if (local_50->pixels[arraysize._4_4_] == (uchar *)0x0) goto LAB_0012c739;
      }
      goto LAB_0012c494;
    }
  }
  else {
LAB_0012c494:
    if (oim->paletteQuantizationMethod == 2) {
      if (cimP != (gdImagePtr *)0x0) {
        gdImageDestroy(local_50);
      }
      if (oim->paletteQuantizationSpeed == 0) {
        local_64 = 2;
      }
      else {
        local_64 = oim->paletteQuantizationSpeed;
      }
      src = gdImageNeuQuant(oim,(int)cimP_local,local_64);
      if (cimP != (gdImagePtr *)0x0) {
        *cimP = src;
      }
      if (src == (gdImagePtr)0x0) {
        return 0;
      }
      free_truecolor_image_data(oim);
      gdImageCopy(oim,src,0,0,0,0,oim->sx,oim->sy);
      gdImageDestroy(src);
      return 1;
    }
    _conversionSucceeded = (my_cquantize_ptr)gdCalloc(0x28,1);
    if (_conversionSucceeded != (my_cquantize_ptr)0x0) {
      _conversionSucceeded->fserrors = (FSERRPTR)0x0;
      _conversionSucceeded->error_limiter = (int *)0x0;
      ppahVar3 = (hist3d)gdMalloc(0x100);
      _conversionSucceeded->histogram = ppahVar3;
      for (arraysize._4_4_ = 0; arraysize._4_4_ < 0x20; arraysize._4_4_ = arraysize._4_4_ + 1) {
        pahVar4 = (hist2d)gdMalloc(0x1000);
        _conversionSucceeded->histogram[arraysize._4_4_] = pahVar4;
        if (_conversionSucceeded->histogram[arraysize._4_4_] == (hist2d)0x0) goto LAB_0012c739;
      }
      pFVar5 = (FSERRPTR)gdMalloc(6);
      _conversionSucceeded->fserrors = pFVar5;
      init_error_limit(oim,local_50,_conversionSucceeded);
      size = (long)(local_50->sx + 2) * 6;
      pFVar5 = (FSERRPTR)gdReallocEx(_conversionSucceeded->fserrors,size);
      _conversionSucceeded->fserrors = pFVar5;
      if (_conversionSucceeded->fserrors != (FSERRPTR)0x0) {
        memset(_conversionSucceeded->fserrors,0,size);
        _conversionSucceeded->on_odd_row = 0;
        zeroHistogram(_conversionSucceeded->histogram);
        prescan_quantize(oim,local_50,_conversionSucceeded);
        select_colors(oim,local_50,_conversionSucceeded,(int)cimP_local);
        zeroHistogram(_conversionSucceeded->histogram);
        if (dither == 0) {
          pass2_no_dither(oim,local_50,_conversionSucceeded);
        }
        else {
          pass2_fs_dither(oim,local_50,_conversionSucceeded);
        }
        if (-1 < oim->transparent) {
          local_50->transparent = local_50->colorsTotal;
          local_50->colorsTotal = local_50->colorsTotal + 1;
        }
        arraysize._0_4_ = 1;
        if (cimP == (gdImagePtr *)0x0) {
          free_truecolor_image_data(oim);
        }
        goto LAB_0012c7d9;
      }
    }
  }
LAB_0012c739:
  arraysize._0_4_ = 0;
  if (oim->trueColor != 0) {
    if (cimP == (gdImagePtr *)0x0) {
      if (local_50->pixels != (uchar **)0x0) {
        for (arraysize._4_4_ = 0; arraysize._4_4_ < local_50->sy;
            arraysize._4_4_ = arraysize._4_4_ + 1) {
          if (local_50->pixels[arraysize._4_4_] != (uchar *)0x0) {
            gdFree(local_50->pixels[arraysize._4_4_]);
          }
        }
        gdFree(local_50->pixels);
      }
      local_50->pixels = (uchar **)0x0;
    }
    else {
      gdImageDestroy(local_50);
      *cimP = (gdImagePtr)0x0;
    }
  }
LAB_0012c7d9:
  if (_conversionSucceeded != (my_cquantize_ptr)0x0) {
    if (_conversionSucceeded->histogram != (hist3d)0x0) {
      for (arraysize._4_4_ = 0; arraysize._4_4_ < 0x20; arraysize._4_4_ = arraysize._4_4_ + 1) {
        if (_conversionSucceeded->histogram[arraysize._4_4_] != (hist2d)0x0) {
          gdFree(_conversionSucceeded->histogram[arraysize._4_4_]);
        }
      }
      gdFree(_conversionSucceeded->histogram);
    }
    if (_conversionSucceeded->fserrors != (FSERRPTR)0x0) {
      gdFree(_conversionSucceeded->fserrors);
    }
    if (_conversionSucceeded->error_limiter_storage != (int *)0x0) {
      gdFree(_conversionSucceeded->error_limiter_storage);
    }
    gdFree(_conversionSucceeded);
  }
  return (int)arraysize;
}

Assistant:

static int gdImageTrueColorToPaletteBody (gdImagePtr oim, int dither, int colorsWanted, gdImagePtr *cimP)
{
	my_cquantize_ptr cquantize = NULL;
	int i, conversionSucceeded=0;

	/* Allocate the JPEG palette-storage */
	size_t arraysize;
	int maxColors = gdMaxColors;
	gdImagePtr nim;

	if (cimP) {
		nim = gdImageCreate(oim->sx, oim->sy);
		*cimP = nim;
		if (!nim) {
			return FALSE;
		}
	} else {
		nim = oim;
	}

	if (!oim->trueColor) {
		/* (Almost) nothing to do! */
		if (cimP) {
			gdImageCopy(nim, oim, 0, 0, 0, 0, oim->sx, oim->sy);
			*cimP = nim;
		}
		return TRUE;
	}

	/* If we have a transparent color (the alphaless mode of transparency), we
	 * must reserve a palette entry for it at the end of the palette. */
	if (oim->transparent >= 0) {
		maxColors--;
	}
	if (colorsWanted > maxColors) {
		colorsWanted = maxColors;
	}
	if (!cimP) {
		nim->pixels = gdCalloc (sizeof (unsigned char *), oim->sy);
		if (!nim->pixels) {
			/* No can do */
			goto outOfMemory;
		}
		for (i = 0; (i < nim->sy); i++) {
			nim->pixels[i] = (unsigned char *) gdCalloc (sizeof (unsigned char), oim->sx);
			if (!nim->pixels[i]) {
				goto outOfMemory;
			}
		}
	}


	if (oim->paletteQuantizationMethod == GD_QUANT_NEUQUANT) {
		if (cimP) { /* NeuQuant alwasy creates a copy, so the new blank image can't be used */
			gdImageDestroy(nim);
		}
		nim = gdImageNeuQuant(oim, colorsWanted, oim->paletteQuantizationSpeed ? oim->paletteQuantizationSpeed : 2);
		if (cimP) {
			*cimP = nim;
		} 
		if (!nim) {
			return FALSE;
		} else {
			free_truecolor_image_data(oim);
			gdImageCopy(oim, nim, 0, 0, 0, 0, oim->sx, oim->sy);
			gdImageDestroy(nim);
		}
		return TRUE;
	}


#ifdef HAVE_LIBIMAGEQUANT
	if (oim->paletteQuantizationMethod == GD_QUANT_DEFAULT ||
	        oim->paletteQuantizationMethod == GD_QUANT_LIQ) {
		liq_attr *attr = liq_attr_create_with_allocator(gdMalloc, gdFree);
		liq_image *image;
		liq_result *remap;
		int remapped_ok = 0;

		liq_set_max_colors(attr, colorsWanted);

		/* by default make it fast to match speed of previous implementation */
		liq_set_speed(attr, oim->paletteQuantizationSpeed ? oim->paletteQuantizationSpeed : 9);
		if (oim->paletteQuantizationMaxQuality) {
			liq_set_quality(attr, oim->paletteQuantizationMinQuality, oim->paletteQuantizationMaxQuality);
		}
		image = liq_image_create_custom(attr, convert_gdpixel_to_rgba, oim, oim->sx, oim->sy, 0);
		remap = liq_quantize_image(attr, image);
		if (!remap) { /* minimum quality not met, leave image unmodified */
			liq_image_destroy(image);
			liq_attr_destroy(attr);
			goto outOfMemory;
		}

		liq_set_dithering_level(remap, dither ? 1 : 0);
		if (LIQ_OK == liq_write_remapped_image_rows(remap, image, output_buf)) {
			remapped_ok = 1;
			const liq_palette *pal = liq_get_palette(remap);
			nim->transparent = -1;
			unsigned int icolor;
			for(icolor=0; icolor < pal->count; icolor++) {
				nim->open[icolor] = 0;
				nim->red[icolor] = pal->entries[icolor].r * gdRedMax/255;
				nim->green[icolor] = pal->entries[icolor].g * gdGreenMax/255;
				nim->blue[icolor] = pal->entries[icolor].b * gdBlueMax/255;
				int alpha = pal->entries[icolor].a * gdAlphaMax/255;
				if (gdAlphaOpaque < gdAlphaTransparent) {
					alpha = gdAlphaTransparent - alpha;
				}
				nim->alpha[icolor] = alpha;
				if (nim->transparent == -1 && alpha == gdAlphaTransparent) {
					nim->transparent = icolor;
				}
			}
			nim->colorsTotal = pal->count;
		}
		liq_result_destroy(remap);
		liq_image_destroy(image);
		liq_attr_destroy(attr);

		if (remapped_ok) {
			if (!cimP) {
				free_truecolor_image_data(oim);
			}
			return TRUE;
		}
	}
#endif

	cquantize = (my_cquantize_ptr) gdCalloc (sizeof (my_cquantizer), 1);
	if (!cquantize) {
		/* No can do */
		goto outOfMemory;
	}
	cquantize->fserrors = NULL;	/* flag optional arrays not allocated */
	cquantize->error_limiter = NULL;


	/* Allocate the histogram/inverse colormap storage */
	cquantize->histogram = (hist3d) gdMalloc (HIST_C0_ELEMS * sizeof (hist2d));
	for (i = 0; i < HIST_C0_ELEMS; i++) {
		cquantize->histogram[i] =
		    (hist2d) gdMalloc (HIST_C1_ELEMS * HIST_C2_ELEMS * sizeof (histcell));
		if (!cquantize->histogram[i]) {
			goto outOfMemory;
		}
	}


	cquantize->fserrors = (FSERRPTR) gdMalloc (3 * sizeof (FSERROR));
	init_error_limit (oim, nim, cquantize);
	arraysize = (size_t) ((nim->sx + 2) * (3 * sizeof (FSERROR)));
	/* Allocate Floyd-Steinberg workspace. */
	cquantize->fserrors = gdReallocEx(cquantize->fserrors, arraysize);
	if (!cquantize->fserrors) {
		goto outOfMemory;
	}
	memset(cquantize->fserrors, 0, arraysize);
	cquantize->on_odd_row = FALSE;

	/* Do the work! */
	zeroHistogram (cquantize->histogram);
	prescan_quantize (oim, nim, cquantize);
	/* TBB 2.0.5: pass colorsWanted, not 256! */
	select_colors (oim, nim, cquantize, colorsWanted);
	zeroHistogram (cquantize->histogram);
	if (dither) {
		pass2_fs_dither (oim, nim, cquantize);
	} else {
		pass2_no_dither (oim, nim, cquantize);
	}
#if 0				/* 2.0.12; we no longer attempt full alpha in palettes */
	if (cquantize->transparentIsPresent) {
		int mt = -1;
		int mtIndex = -1;
		for (i = 0; (i < im->colorsTotal); i++) {
			if (im->alpha[i] > mt) {
				mtIndex = i;
				mt = im->alpha[i];
			}
		}
		for (i = 0; (i < im->colorsTotal); i++) {
			if (im->alpha[i] == mt) {
				im->alpha[i] = gdAlphaTransparent;
			}
		}
	}
	if (cquantize->opaqueIsPresent) {
		int mo = 128;
		int moIndex = -1;
		for (i = 0; (i < im->colorsTotal); i++) {
			if (im->alpha[i] < mo) {
				moIndex = i;
				mo = im->alpha[i];
			}
		}
		for (i = 0; (i < im->colorsTotal); i++) {
			if (im->alpha[i] == mo) {
				im->alpha[i] = gdAlphaOpaque;
			}
		}
	}
#endif

	/* If we had a 'transparent' color, increment the color count so it's
	 * officially in the palette and convert the transparent variable to point to
	 * an index rather than a color (Its data already exists and transparent
	 * pixels have already been mapped to it by this point, it is done late as to
	 * avoid color matching / dithering with it). */
	if (oim->transparent >= 0) {
		nim->transparent = nim->colorsTotal;
		nim->colorsTotal++;
	}

	/* Success! Get rid of the truecolor image data. */
	conversionSucceeded = TRUE;
	if (!cimP) {
		free_truecolor_image_data(oim);
	}

	goto freeQuantizeData;
	/* Tediously free stuff. */
outOfMemory:
	conversionSucceeded = FALSE;
	if (oim->trueColor) {
		if (!cimP) {
			/* On failure only */
			if (nim->pixels) {
				for (i = 0; i < nim->sy; i++) {
					if (nim->pixels[i]) {
						gdFree (nim->pixels[i]);
					}
				}
				gdFree (nim->pixels);
			}
			nim->pixels = NULL;
		} else {
			gdImageDestroy(nim);
			*cimP = 0;
		}
	}

freeQuantizeData:
	if (cquantize) {
		if (cquantize->histogram) {
			for (i = 0; i < HIST_C0_ELEMS; i++) {
				if (cquantize->histogram[i]) {
					gdFree (cquantize->histogram[i]);
				}
			}
			gdFree (cquantize->histogram);
		}
		if (cquantize->fserrors) {
			gdFree (cquantize->fserrors);
		}
		if (cquantize->error_limiter_storage) {
			gdFree (cquantize->error_limiter_storage);
		}
		gdFree (cquantize);
	}

	return conversionSucceeded;
}